

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O2

void Minisat::sort<Minisat::Option*,Minisat::Option::OptionLt>(undefined8 *array,ulong param_2)

{
  Option *y;
  undefined8 uVar1;
  bool bVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  OptionLt local_9a;
  OptionLt local_99;
  uint local_98;
  int local_94;
  ulong local_90;
  uint local_84;
  ulong local_80;
  ulong local_78;
  long local_70;
  long local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  undefined8 *local_48;
  ulong local_40;
  ulong local_38;
  
  local_98 = (uint)param_2;
  uVar6 = param_2 & 0xffffffff;
  if (0xf < (int)local_98) {
    if (local_98 < 0x21) {
      y = (Option *)array[param_2 >> 1 & 0x7fffffff];
      uVar11 = 0xffffffffffffffff;
      while( true ) {
        uVar11 = (ulong)(int)uVar11;
        puVar3 = array + uVar11;
        do {
          uVar11 = uVar11 + 1;
          puVar5 = puVar3 + 1;
          puVar3 = puVar3 + 1;
          bVar2 = Option::OptionLt::operator()(&local_9a,(Option *)*puVar5,y);
        } while (bVar2);
        uVar6 = (ulong)(int)uVar6;
        do {
          lVar4 = uVar6 - 1;
          uVar6 = uVar6 - 1;
          bVar2 = Option::OptionLt::operator()(&local_9a,y,(Option *)array[lVar4]);
        } while (bVar2);
        if ((long)uVar6 <= (long)uVar11) break;
        uVar1 = *puVar3;
        *puVar3 = array[uVar6];
        array[uVar6] = uVar1;
      }
      sort<Minisat::Option*,Minisat::Option::OptionLt>(array,uVar11 & 0xffffffff);
      sort<Minisat::Option*,Minisat::Option::OptionLt>(puVar3,local_98 - (int)uVar11);
    }
    else {
      param_2 = param_2 & 0xffffffff;
      local_78 = param_2 * 8;
      puVar3 = (undefined8 *)operator_new__(local_78);
      local_90 = 0;
      uVar7 = 0;
      uVar11 = 1;
      local_80 = param_2;
      while (puVar5 = puVar3, iVar8 = (int)uVar11, iVar8 < (int)uVar6) {
        local_84 = iVar8 * 2;
        local_68 = (long)(int)local_84;
        local_58 = (long)iVar8;
        local_70 = local_68 * 8;
        uVar10 = 0;
        puVar3 = puVar5;
        local_60 = uVar11;
        while (uVar11 = uVar10 + local_58, (long)uVar11 < (long)param_2) {
          local_94 = (int)local_60 + (int)uVar11;
          if ((int)uVar6 <= local_94) {
            local_94 = (int)uVar6;
          }
          uVar6 = uVar11 & 0xffffffff;
          uVar7 = uVar10;
          local_50 = uVar10;
          local_48 = puVar3;
          local_40 = uVar11;
          while( true ) {
            lVar9 = (long)(int)uVar10;
            iVar8 = (int)uVar6;
            lVar4 = (long)iVar8;
            if (((long)local_40 <= lVar9) || (local_94 <= iVar8)) break;
            local_38 = uVar7;
            bVar2 = Option::OptionLt::operator()
                              (&local_99,(Option *)array[lVar9],(Option *)array[iVar8]);
            lVar4 = (long)iVar8;
            if (bVar2) {
              lVar4 = lVar9;
            }
            uVar10 = (ulong)((int)uVar10 + (uint)bVar2);
            uVar6 = (ulong)(iVar8 + (uint)!bVar2);
            puVar5[local_38] = array[lVar4];
            uVar7 = local_38 + 1;
            puVar3 = puVar3 + 1;
          }
          for (; lVar9 < (long)local_40; lVar9 = lVar9 + 1) {
            puVar5[uVar7] = array[lVar9];
            uVar7 = uVar7 + 1;
            puVar3 = puVar3 + 1;
          }
          for (; lVar4 < local_94; lVar4 = lVar4 + 1) {
            uVar7 = uVar7 + 1;
            *puVar3 = array[lVar4];
            puVar3 = puVar3 + 1;
          }
          puVar3 = (undefined8 *)((long)local_48 + local_70);
          uVar6 = (ulong)local_98;
          param_2 = local_80;
          uVar10 = local_50 + local_68;
        }
        for (uVar7 = (ulong)(int)uVar7; (long)uVar7 < (long)param_2; uVar7 = uVar7 + 1) {
          puVar5[uVar7] = array[uVar7];
        }
        local_90 = (ulong)((int)local_90 + 1);
        puVar3 = array;
        array = puVar5;
        uVar11 = (ulong)local_84;
      }
      if ((local_90 & 1) != 0) {
        memcpy(puVar5,array,local_78);
        puVar5 = array;
      }
      if (puVar5 != (undefined8 *)0x0) {
        operator_delete__(puVar5);
      }
    }
    return;
  }
  selectionSort<Minisat::Option*,Minisat::Option::OptionLt>(array,param_2 & 0xffffffff);
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}